

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

Word * __thiscall VM::word(VM *this,uint address)

{
  pointer pWVar1;
  VMException *pVVar2;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((address & 3) != 0) {
    pVVar2 = (VMException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"unaligned memory access",&local_59);
    VMException::VMException(pVVar2,&local_38);
    __cxa_throw(pVVar2,&VMException::typeinfo,std::logic_error::~logic_error);
  }
  pWVar1 = (this->_program).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(address >> 2) <
      (ulong)((long)(this->_program).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pWVar1 >> 2)) {
    return pWVar1 + (address >> 2);
  }
  pVVar2 = (VMException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_58,"out of program memory access",&local_59);
  VMException::VMException(pVVar2,&local_58);
  __cxa_throw(pVVar2,&VMException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Word &VM::word(unsigned address) {
    if(address % 4) {
        throw VMException{"unaligned memory access"};
    }
    if(address / 4 >= _program.size()) {
        throw VMException{"out of program memory access"};
    }
    return _program[address / 4];
}